

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

bool __thiscall QPDFObjectHandle::getValueAsUTF8(QPDFObjectHandle *this,string *value)

{
  QPDF_String *this_00;
  string local_38;
  
  this_00 = ::qpdf::BaseHandle::as<QPDF_String>(&this->super_BaseHandle);
  if (this_00 != (QPDF_String *)0x0) {
    QPDF_String::getUTF8Val_abi_cxx11_(&local_38,this_00);
    std::__cxx11::string::operator=((string *)value,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return this_00 != (QPDF_String *)0x0;
}

Assistant:

bool
QPDFObjectHandle::getValueAsUTF8(std::string& value) const
{
    if (auto str = as<QPDF_String>()) {
        value = str->getUTF8Val();
        return true;
    }
    return false;
}